

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ds_list.c
# Opt level: O2

DsList * ds_list_create(void)

{
  DsList *pDVar1;
  
  pDVar1 = (DsList *)calloc(1,0x18);
  if (pDVar1 != (DsList *)0x0) {
    return pDVar1;
  }
  exit(2);
}

Assistant:

DsList *ds_list_create(void)
{
    DsList *list = (DsList *)malloc(sizeof(DsList));
    if (NULL == list)
        exit(DS_STATUS_OUTMEM);
    list->entry = NULL;
    list->equal = NULL;
    list->size = 0;
    return list;
}